

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_wide_xors(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *bitmap2;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1_00;
  roaring_bitmap_t *r2_00;
  char *__s;
  long lVar2;
  int local_58;
  
  bitmap1 = roaring_bitmap_xor_many(count,rnorun);
  bitmap2 = roaring_bitmap_xor_many(count,rruns);
  _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
  if (_Var1) {
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    _assert_true((ulong)_Var1,"roaring_bitmap_equals(tempornorun, temporruns)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                 ,0x2ce);
    r1 = *rnorun;
    r2 = *rruns;
    if (count != 1) {
      _Var1 = roaring_bitmap_equals(r1,r2);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[0], rruns[0])",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x2d6);
      _Var1 = roaring_bitmap_equals(rnorun[1],rruns[1]);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[1], rruns[1])",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x2d7);
      r1 = roaring_bitmap_xor(*rnorun,rnorun[1]);
      r2 = roaring_bitmap_xor(*rruns,rruns[1]);
      _Var1 = roaring_bitmap_equals(r1,r2);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x2da);
      local_58 = (int)count;
      for (lVar2 = 2; lVar2 < local_58; lVar2 = lVar2 + 1) {
        _Var1 = roaring_bitmap_equals(rnorun[lVar2],rruns[lVar2]);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[i], rruns[i])",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2dc);
        _Var1 = roaring_bitmap_equals(r1,r2);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2dd);
        r1_00 = roaring_bitmap_xor(rnorun[lVar2],r1);
        r2_00 = roaring_bitmap_xor(rruns[lVar2],r2);
        _Var1 = roaring_bitmap_equals(r1_00,r2_00);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(t1, t2)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2e2);
        roaring_bitmap_free(r1);
        roaring_bitmap_free(r2);
        _Var1 = roaring_bitmap_equals(r1_00,r2_00);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2e7);
        r1 = r1_00;
        r2 = r2_00;
      }
    }
    _Var1 = slow_bitmap_equals(r1,bitmap1);
    if (_Var1) {
      _Var1 = slow_bitmap_equals(bitmap2,r2);
      if (_Var1) {
        roaring_bitmap_free(bitmap1);
        roaring_bitmap_free(bitmap2);
        roaring_bitmap_free(r1);
        roaring_bitmap_free(r2);
        return true;
      }
      __s = "[compare_wide_xors] Xors don\'t agree! (runs) ";
    }
    else {
      __s = "[compare_wide_xors] Xors don\'t agree! (regular) ";
    }
  }
  else {
    __s = "[compare_wide_xors] Xors don\'t agree! (fast run-norun) ";
  }
  puts(__s);
  return false;
}

Assistant:

bool compare_wide_xors(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                       size_t count) {
    roaring_bitmap_t *tempornorun =
        roaring_bitmap_xor_many(count, (const roaring_bitmap_t **)rnorun);
    roaring_bitmap_t *temporruns =
        roaring_bitmap_xor_many(count, (const roaring_bitmap_t **)rruns);
    if (!slow_bitmap_equals(tempornorun, temporruns)) {
        printf("[compare_wide_xors] Xors don't agree! (fast run-norun) \n");
        return false;
    }
    assert_true(roaring_bitmap_equals(tempornorun, temporruns));

    roaring_bitmap_t *longtempornorun;
    roaring_bitmap_t *longtemporruns;
    if (count == 1) {
        longtempornorun = rnorun[0];
        longtemporruns = rruns[0];
    } else {
        assert_true(roaring_bitmap_equals(rnorun[0], rruns[0]));
        assert_true(roaring_bitmap_equals(rnorun[1], rruns[1]));
        longtempornorun = roaring_bitmap_xor(rnorun[0], rnorun[1]);
        longtemporruns = roaring_bitmap_xor(rruns[0], rruns[1]);
        assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        for (int i = 2; i < (int)count; ++i) {
            assert_true(roaring_bitmap_equals(rnorun[i], rruns[i]));
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));

            roaring_bitmap_t *t1 =
                roaring_bitmap_xor(rnorun[i], longtempornorun);
            roaring_bitmap_t *t2 = roaring_bitmap_xor(rruns[i], longtemporruns);
            assert_true(roaring_bitmap_equals(t1, t2));
            roaring_bitmap_free(longtempornorun);
            longtempornorun = t1;
            roaring_bitmap_free(longtemporruns);
            longtemporruns = t2;
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        }
    }
    if (!slow_bitmap_equals(longtempornorun, tempornorun)) {
        printf("[compare_wide_xors] Xors don't agree! (regular) \n");
        return false;
    }
    if (!slow_bitmap_equals(temporruns, longtemporruns)) {
        printf("[compare_wide_xors] Xors don't agree! (runs) \n");
        return false;
    }
    roaring_bitmap_free(tempornorun);
    roaring_bitmap_free(temporruns);

    roaring_bitmap_free(longtempornorun);
    roaring_bitmap_free(longtemporruns);

    return true;
}